

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_client.hpp
# Opt level: O2

type * __thiscall
rest_rpc::rpc_client::call<5000ul,person>
          (type *__return_storage_ptr__,rpc_client *this,string *rpc_name)

{
  future_status fVar1;
  out_of_range *this_00;
  future_result<rest_rpc::req_result> future_result;
  req_result local_30;
  
  async_call<(rest_rpc::CallModel)0>(&future_result,this,rpc_name);
  local_30.data_._M_dataplus._M_p = (pointer)0x1388;
  fVar1 = std::__basic_future<rest_rpc::req_result>::wait_for<long,std::ratio<1l,1000l>>
                    (&future_result.future.super___basic_future<rest_rpc::req_result>,
                     (duration<long,_std::ratio<1L,_1000L>_> *)&local_30);
  if (1 < fVar1 - timeout) {
    std::future<rest_rpc::req_result>::get(&local_30,&future_result.future);
    req_result::as<person>(__return_storage_ptr__,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&future_result.future.super___basic_future<rest_rpc::req_result>._M_state.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    return __return_storage_ptr__;
  }
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range(this_00,"timeout or deferred");
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

typename std::enable_if<!std::is_void<T>::value, T>::type
  call(const std::string &rpc_name, Args &&...args) {
    auto future_result =
        async_call<FUTURE>(rpc_name, std::forward<Args>(args)...);
    auto status = future_result.wait_for(std::chrono::milliseconds(TIMEOUT));
    if (status == std::future_status::timeout ||
        status == std::future_status::deferred) {
      throw std::out_of_range("timeout or deferred");
    }

    return future_result.get().template as<T>();
  }